

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_keyword_expr(gvisitor_t *self,gnode_keyword_expr_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  uint32_t local_9c;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_6c;
  uint32_t local_5c;
  uint32_t local_4c;
  gtoken_t type;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_keyword_expr_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    switch((node->base).token.type) {
    case TOK_KEY_SUPER:
      ircode_register_push(code_00,0);
      break;
    default:
      report_error(self,&node->base,"Invalid keyword expression.");
      break;
    case TOK_KEY_TRUE:
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1005,local_8c);
      break;
    case TOK_KEY_FALSE:
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_9c = 0;
      }
      else {
        local_9c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1006,local_9c);
      break;
    case TOK_KEY_NULL:
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1002,local_5c);
      break;
    case TOK_KEY_UNDEFINED:
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1003,local_7c);
      break;
    case TOK_KEY_CURRFUNC:
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1007,local_4c);
      break;
    case TOK_KEY_CURRARGS:
      *(undefined1 *)((long)plVar1 + 0xb4) = 1;
      if (node == (gnode_keyword_expr_t *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = (node->base).token.lineno;
      }
      ircode_add_constant(code_00,0x1004,local_6c);
    }
  }
  return;
}

Assistant:

static void visit_keyword_expr (gvisitor_t *self, gnode_keyword_expr_t *node) {
    DEBUG_CODEGEN("visit_keyword_expr %s", token_name(node->base.token.type));
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    gtoken_t type = NODE_TOKEN_TYPE(node);
    switch (type) {
        case TOK_KEY_CURRFUNC:
			ircode_add_constant(code, CPOOL_VALUE_FUNC, LINE_NUMBER(node));
            break;

        case TOK_KEY_NULL:
			ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            break;

        case TOK_KEY_SUPER:
            ircode_register_push(code, 0);
            break;

        case TOK_KEY_CURRARGS:
            // compiler can know in advance if arguments special array is used
            context_function->useargs = true;
			ircode_add_constant(code, CPOOL_VALUE_ARGUMENTS, LINE_NUMBER(node));
            break;

        case TOK_KEY_UNDEFINED:
			ircode_add_constant(code, CPOOL_VALUE_UNDEFINED, LINE_NUMBER(node));
            break;

        case TOK_KEY_TRUE:
			ircode_add_constant(code, CPOOL_VALUE_TRUE, LINE_NUMBER(node));
            break;

        case TOK_KEY_FALSE:
			ircode_add_constant(code, CPOOL_VALUE_FALSE, LINE_NUMBER(node));
            break;

        default:
            report_error(self, (gnode_t *)node, "Invalid keyword expression.");
            break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}